

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByName(Descriptor *this,string_view name)

{
  FileDescriptor *pFVar1;
  SymbolT pFVar2;
  Descriptor *this_local;
  string_view name_local;
  
  pFVar1 = file(this);
  pFVar2 = FileDescriptorTables::
           FindNestedSymbol<google::protobuf::(anonymous_namespace)::ParentNameFieldQuery>
                     (pFVar1->tables_,this,name);
  return pFVar2;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByName(
    absl::string_view name) const {
  return file()->tables_->FindNestedSymbol<ParentNameFieldQuery>(this, name);
}